

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

int32_t uloc_setKeywordValue_63
                  (char *keywordName,char *keywordValue,char *buffer,int32_t bufferCapacity,
                  UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  char cVar3;
  int32_t iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  bool bVar8;
  char *local_1a0;
  int local_184;
  int iStack_180;
  int32_t keyValueLen;
  char *keyValueTail;
  char local_166;
  undefined1 local_160 [2];
  char keyValuePrefix;
  UBool handledInputKeyAndValue;
  int32_t updatedKeysAndValuesLen;
  CharString updatedKeysAndValues;
  char *keywordStart;
  char *startSearchHere;
  char *nextEqualsign;
  char *nextSeparator;
  char local_f8 [4];
  int32_t rc;
  char localeKeywordNameBuffer [25];
  char keywordValueBuffer [97];
  char local_68 [8];
  char keywordNameBuffer [25];
  int32_t needLen;
  int32_t bufLen;
  int32_t keywordValueLen;
  int32_t keywordNameLen;
  UErrorCode *status_local;
  int32_t bufferCapacity_local;
  char *buffer_local;
  char *keywordValue_local;
  char *keywordName_local;
  
  stack0xffffffffffffffb8 = 0;
  updatedKeysAndValues.len = 0;
  updatedKeysAndValues._60_4_ = 0;
  icu_63::CharString::CharString((CharString *)local_160);
  bVar1 = false;
  local_166 = '@';
  UVar2 = U_FAILURE(*status);
  if (UVar2 == '\0') {
    if (((keywordName == (char *)0x0) || (*keywordName == '\0')) || (bufferCapacity < 2)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      keywordName_local._4_4_ = 0;
    }
    else {
      sVar6 = strlen(buffer);
      keywordName_local._4_4_ = (int)sVar6;
      if (bufferCapacity < keywordName_local._4_4_) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        keywordName_local._4_4_ = 0;
      }
      else {
        iVar4 = locale_canonKeywordName(local_68,keywordName,status);
        UVar2 = U_FAILURE(*status);
        if (UVar2 == '\0') {
          needLen = 0;
          buffer_local = keywordValue;
          if (keywordValue != (char *)0x0) {
            while (*buffer_local != '\0') {
              UVar2 = uprv_isASCIILetter_63(*buffer_local);
              if ((((UVar2 == '\0') && ((*buffer_local < '0' || ('9' < *buffer_local)))) &&
                  (*buffer_local != '_')) &&
                 (((*buffer_local != '-' && (*buffer_local != '+')) && (*buffer_local != '/')))) {
                *status = U_ILLEGAL_ARGUMENT_ERROR;
                keywordName_local._4_4_ = 0;
                goto LAB_003b4046;
              }
              if (0x5f < needLen) {
                *status = U_INTERNAL_PROGRAM_ERROR;
                keywordName_local._4_4_ = 0;
                goto LAB_003b4046;
              }
              localeKeywordNameBuffer[(long)needLen + 0x18] = *buffer_local;
              needLen = needLen + 1;
              buffer_local = buffer_local + 1;
            }
          }
          localeKeywordNameBuffer[(long)needLen + 0x18] = '\0';
          keywordStart = locale_getKeywordsStart_63(buffer);
          if ((keywordStart == (char *)0x0) || (pcVar7 = keywordStart, keywordStart[1] == '\0')) {
            if (needLen != 0) {
              register0x00000000 = keywordName_local._4_4_ + iVar4 + 2 + needLen;
              if (keywordStart == (char *)0x0) {
                keywordStart = buffer + keywordName_local._4_4_;
              }
              else {
                register0x00000000 = register0x00000000 + -1;
              }
              if (stack0xffffffffffffffb8 < bufferCapacity) {
                pcVar7 = keywordStart + 1;
                *keywordStart = '@';
                strcpy(pcVar7,local_68);
                pcVar7[iVar4] = '=';
                strcpy(pcVar7 + iVar4 + 1,localeKeywordNameBuffer + 0x18);
                keywordName_local._4_4_ = stack0xffffffffffffffb8;
              }
              else {
                *status = U_BUFFER_OVERFLOW_ERROR;
                keywordName_local._4_4_ = stack0xffffffffffffffb8;
              }
            }
          }
          else {
            while (updatedKeysAndValues._56_8_ = pcVar7, updatedKeysAndValues._56_8_ != 0) {
              updatedKeysAndValues._56_8_ = updatedKeysAndValues._56_8_ + 1;
              startSearchHere = strchr((char *)updatedKeysAndValues._56_8_,0x3d);
              if (startSearchHere == (char *)0x0) {
                *status = U_ILLEGAL_ARGUMENT_ERROR;
                keywordName_local._4_4_ = 0;
                goto LAB_003b4046;
              }
              for (; _iStack_180 = startSearchHere, *(char *)updatedKeysAndValues._56_8_ == ' ';
                  updatedKeysAndValues._56_8_ = updatedKeysAndValues._56_8_ + 1) {
              }
              while( true ) {
                bVar8 = false;
                if ((ulong)updatedKeysAndValues._56_8_ < _iStack_180) {
                  bVar8 = _iStack_180[-1] == ' ';
                }
                if (!bVar8) break;
                _iStack_180 = _iStack_180 + -1;
              }
              if ((char *)updatedKeysAndValues._56_8_ == _iStack_180) {
                *status = U_ILLEGAL_ARGUMENT_ERROR;
                keywordName_local._4_4_ = 0;
                goto LAB_003b4046;
              }
              local_184 = 0;
              while ((ulong)updatedKeysAndValues._56_8_ < _iStack_180) {
                UVar2 = uprv_isASCIILetter_63(*(char *)updatedKeysAndValues._56_8_);
                if ((UVar2 == '\0') &&
                   ((*(char *)updatedKeysAndValues._56_8_ < '0' ||
                    ('9' < *(char *)updatedKeysAndValues._56_8_)))) {
                  *status = U_ILLEGAL_ARGUMENT_ERROR;
                  keywordName_local._4_4_ = 0;
                  goto LAB_003b4046;
                }
                if (0x17 < local_184) {
                  *status = U_INTERNAL_PROGRAM_ERROR;
                  keywordName_local._4_4_ = 0;
                  goto LAB_003b4046;
                }
                cVar3 = *(char *)updatedKeysAndValues._56_8_;
                updatedKeysAndValues._56_8_ = updatedKeysAndValues._56_8_ + 1;
                cVar3 = uprv_asciitolower_63(cVar3);
                local_f8[local_184] = cVar3;
                local_184 = local_184 + 1;
              }
              local_f8[local_184] = '\0';
              pcVar7 = strchr(startSearchHere,0x3b);
              do {
                startSearchHere = startSearchHere + 1;
              } while (*startSearchHere == ' ');
              local_1a0 = pcVar7;
              if (pcVar7 == (char *)0x0) {
                sVar6 = strlen(startSearchHere);
                local_1a0 = startSearchHere + sVar6;
              }
              _iStack_180 = local_1a0;
              while( true ) {
                bVar8 = false;
                if (startSearchHere < _iStack_180) {
                  bVar8 = _iStack_180[-1] == ' ';
                }
                if (!bVar8) break;
                _iStack_180 = _iStack_180 + -1;
              }
              if (startSearchHere == _iStack_180) {
                *status = U_ILLEGAL_ARGUMENT_ERROR;
                keywordName_local._4_4_ = 0;
                goto LAB_003b4046;
              }
              iVar5 = strcmp(local_68,local_f8);
              if (iVar5 == 0) {
                if (0 < needLen) {
                  icu_63::CharString::append((CharString *)local_160,local_166,status);
                  local_166 = ';';
                  icu_63::CharString::append((CharString *)local_160,local_68,iVar4,status);
                  icu_63::CharString::append((CharString *)local_160,'=',status);
                  icu_63::CharString::append
                            ((CharString *)local_160,localeKeywordNameBuffer + 0x18,needLen,status);
                }
                bVar1 = true;
              }
              else {
                if (((iVar5 < 0) && (0 < needLen)) && (!bVar1)) {
                  icu_63::CharString::append((CharString *)local_160,local_166,status);
                  local_166 = ';';
                  icu_63::CharString::append((CharString *)local_160,local_68,iVar4,status);
                  icu_63::CharString::append((CharString *)local_160,'=',status);
                  icu_63::CharString::append
                            ((CharString *)local_160,localeKeywordNameBuffer + 0x18,needLen,status);
                  bVar1 = true;
                }
                icu_63::CharString::append((CharString *)local_160,local_166,status);
                local_166 = ';';
                icu_63::CharString::append((CharString *)local_160,local_f8,local_184,status);
                icu_63::CharString::append((CharString *)local_160,'=',status);
                icu_63::CharString::append
                          ((CharString *)local_160,startSearchHere,iStack_180 - (int)startSearchHere
                           ,status);
              }
              if (((pcVar7 == (char *)0x0) && (0 < needLen)) && (!bVar1)) {
                icu_63::CharString::append((CharString *)local_160,local_166,status);
                icu_63::CharString::append((CharString *)local_160,local_68,iVar4,status);
                icu_63::CharString::append((CharString *)local_160,'=',status);
                icu_63::CharString::append
                          ((CharString *)local_160,localeKeywordNameBuffer + 0x18,needLen,status);
                bVar1 = true;
              }
            }
            if ((bVar1) && (UVar2 = U_FAILURE(*status), UVar2 == '\0')) {
              iVar4 = icu_63::CharString::length((CharString *)local_160);
              register0x00000000 = ((int)keywordStart - (int)buffer) + iVar4;
              if (register0x00000000 < bufferCapacity) {
                if (0 < iVar4) {
                  pcVar7 = icu_63::CharString::data((CharString *)local_160);
                  strncpy(keywordStart,pcVar7,(long)iVar4);
                }
                buffer[stack0xffffffffffffffb8] = '\0';
                keywordName_local._4_4_ = stack0xffffffffffffffb8;
              }
              else {
                *status = U_BUFFER_OVERFLOW_ERROR;
                keywordName_local._4_4_ = register0x00000000;
              }
            }
          }
        }
        else {
          keywordName_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    keywordName_local._4_4_ = -1;
  }
LAB_003b4046:
  icu_63::CharString::~CharString((CharString *)local_160);
  return keywordName_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_setKeywordValue(const char* keywordName,
                     const char* keywordValue,
                     char* buffer, int32_t bufferCapacity,
                     UErrorCode* status)
{
    /* TODO: sorting. removal. */
    int32_t keywordNameLen;
    int32_t keywordValueLen;
    int32_t bufLen;
    int32_t needLen = 0;
    char keywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    char keywordValueBuffer[ULOC_KEYWORDS_CAPACITY+1];
    char localeKeywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    int32_t rc;
    char* nextSeparator = NULL;
    char* nextEqualsign = NULL;
    char* startSearchHere = NULL;
    char* keywordStart = NULL;
    CharString updatedKeysAndValues;
    int32_t updatedKeysAndValuesLen;
    UBool handledInputKeyAndValue = FALSE;
    char keyValuePrefix = '@';

    if(U_FAILURE(*status)) {
        return -1;
    }
    if (keywordName == NULL || keywordName[0] == 0 || bufferCapacity <= 1) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    bufLen = (int32_t)uprv_strlen(buffer);
    if(bufferCapacity<bufLen) {
        /* The capacity is less than the length?! Is this NULL terminated? */
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    keywordNameLen = locale_canonKeywordName(keywordNameBuffer, keywordName, status);
    if(U_FAILURE(*status)) {
        return 0;
    }

    keywordValueLen = 0;
    if(keywordValue) {
        while (*keywordValue != 0) {
            if (!UPRV_ISALPHANUM(*keywordValue) && !UPRV_OK_VALUE_PUNCTUATION(*keywordValue)) {
                *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed key value */
                return 0;
            }
            if (keywordValueLen < ULOC_KEYWORDS_CAPACITY) {
                /* Should we force lowercase in value to set? */
                keywordValueBuffer[keywordValueLen++] = *keywordValue++;
            } else {
                /* keywordValue too long for internal buffer */
                *status = U_INTERNAL_PROGRAM_ERROR;
                return 0;
            }
        }
    }
    keywordValueBuffer[keywordValueLen] = 0; /* terminate */

    startSearchHere = (char*)locale_getKeywordsStart(buffer);
    if(startSearchHere == NULL || (startSearchHere[1]==0)) {
        if(keywordValueLen == 0) { /* no keywords = nothing to remove */
            return bufLen;
        }

        needLen = bufLen+1+keywordNameLen+1+keywordValueLen;
        if(startSearchHere) { /* had a single @ */
            needLen--; /* already had the @ */
            /* startSearchHere points at the @ */
        } else {
            startSearchHere=buffer+bufLen;
        }
        if(needLen >= bufferCapacity) {
            *status = U_BUFFER_OVERFLOW_ERROR;
            return needLen; /* no change */
        }
        *startSearchHere++ = '@';
        uprv_strcpy(startSearchHere, keywordNameBuffer);
        startSearchHere += keywordNameLen;
        *startSearchHere++ = '=';
        uprv_strcpy(startSearchHere, keywordValueBuffer);
        return needLen;
    } /* end shortcut - no @ */

    keywordStart = startSearchHere;
    /* search for keyword */
    while(keywordStart) {
        const char* keyValueTail;
        int32_t keyValueLen;

        keywordStart++; /* skip @ or ; */
        nextEqualsign = uprv_strchr(keywordStart, '=');
        if (!nextEqualsign) {
            *status = U_ILLEGAL_ARGUMENT_ERROR; /* key must have =value */
            return 0;
        }
        /* strip leading & trailing spaces (TC decided to tolerate these) */
        while(*keywordStart == ' ') {
            keywordStart++;
        }
        keyValueTail = nextEqualsign;
        while (keyValueTail > keywordStart && *(keyValueTail-1) == ' ') {
            keyValueTail--;
        }
        /* now keyValueTail points to first char after the keyName */
        /* copy & normalize keyName from locale */
        if (keywordStart == keyValueTail) {
            *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty keyword name in passed-in locale */
            return 0;
        }
        keyValueLen = 0;
        while (keywordStart < keyValueTail) {
            if (!UPRV_ISALPHANUM(*keywordStart)) {
                *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed keyword name */
                return 0;
            }
            if (keyValueLen < ULOC_KEYWORD_BUFFER_LEN - 1) {
                localeKeywordNameBuffer[keyValueLen++] = uprv_tolower(*keywordStart++);
            } else {
                /* keyword name too long for internal buffer */
                *status = U_INTERNAL_PROGRAM_ERROR;
                return 0;
            }
        }
        localeKeywordNameBuffer[keyValueLen] = 0; /* terminate */

        nextSeparator = uprv_strchr(nextEqualsign, ';');

        /* start processing the value part */
        nextEqualsign++; /* skip '=' */
        /* First strip leading & trailing spaces (TC decided to tolerate these) */
        while(*nextEqualsign == ' ') {
            nextEqualsign++;
        }
        keyValueTail = (nextSeparator)? nextSeparator: nextEqualsign + uprv_strlen(nextEqualsign);
        while(keyValueTail > nextEqualsign && *(keyValueTail-1) == ' ') {
            keyValueTail--;
        }
        if (nextEqualsign == keyValueTail) {
            *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty key value in passed-in locale */
            return 0;
        }

        rc = uprv_strcmp(keywordNameBuffer, localeKeywordNameBuffer);
        if(rc == 0) {
            /* Current entry matches the input keyword. Update the entry */
            if(keywordValueLen > 0) { /* updating a value */
                updatedKeysAndValues.append(keyValuePrefix, *status);
                keyValuePrefix = ';'; /* for any subsequent key-value pair */
                updatedKeysAndValues.append(keywordNameBuffer, keywordNameLen, *status);
                updatedKeysAndValues.append('=', *status);
                updatedKeysAndValues.append(keywordValueBuffer, keywordValueLen, *status);
            } /* else removing this entry, don't emit anything */
            handledInputKeyAndValue = TRUE;
        } else {
           /* input keyword sorts earlier than current entry, add before current entry */
            if (rc < 0 && keywordValueLen > 0 && !handledInputKeyAndValue) {
                /* insert new entry at this location */
                updatedKeysAndValues.append(keyValuePrefix, *status);
                keyValuePrefix = ';'; /* for any subsequent key-value pair */
                updatedKeysAndValues.append(keywordNameBuffer, keywordNameLen, *status);
                updatedKeysAndValues.append('=', *status);
                updatedKeysAndValues.append(keywordValueBuffer, keywordValueLen, *status);
                handledInputKeyAndValue = TRUE;
            }
            /* copy the current entry */
            updatedKeysAndValues.append(keyValuePrefix, *status);
            keyValuePrefix = ';'; /* for any subsequent key-value pair */
            updatedKeysAndValues.append(localeKeywordNameBuffer, keyValueLen, *status);
            updatedKeysAndValues.append('=', *status);
            updatedKeysAndValues.append(nextEqualsign, static_cast<int32_t>(keyValueTail-nextEqualsign), *status);
        }
        if (!nextSeparator && keywordValueLen > 0 && !handledInputKeyAndValue) {
            /* append new entry at the end, it sorts later than existing entries */
            updatedKeysAndValues.append(keyValuePrefix, *status);
            /* skip keyValuePrefix update, no subsequent key-value pair */
            updatedKeysAndValues.append(keywordNameBuffer, keywordNameLen, *status);
            updatedKeysAndValues.append('=', *status);
            updatedKeysAndValues.append(keywordValueBuffer, keywordValueLen, *status);
            handledInputKeyAndValue = TRUE;
        }
        keywordStart = nextSeparator;
    } /* end loop searching */

    /* Any error from updatedKeysAndValues.append above would be internal and not due to
     * problems with the passed-in locale. So if we did encounter problems with the
     * passed-in locale above, those errors took precedence and overrode any error
     * status from updatedKeysAndValues.append, and also caused a return of 0. If there
     * are errors here they are from updatedKeysAndValues.append; they do cause an
     * error return but the passed-in locale is unmodified and the original bufLen is
     * returned.
     */
    if (!handledInputKeyAndValue || U_FAILURE(*status)) {
        /* if input key/value specified removal of a keyword not present in locale, or
         * there was an error in CharString.append, leave original locale alone. */
        return bufLen;
    }

    updatedKeysAndValuesLen = updatedKeysAndValues.length();
    /* needLen = length of the part before '@' + length of updated key-value part including '@' */
    needLen = (int32_t)(startSearchHere - buffer) + updatedKeysAndValuesLen;
    if(needLen >= bufferCapacity) {
        *status = U_BUFFER_OVERFLOW_ERROR;
        return needLen; /* no change */
    }
    if (updatedKeysAndValuesLen > 0) {
        uprv_strncpy(startSearchHere, updatedKeysAndValues.data(), updatedKeysAndValuesLen);
    }
    buffer[needLen]=0;
    return needLen;
}